

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode addReference(UA_Server *server,UA_Session *session,UA_AddReferencesItem *item)

{
  UA_StatusCode UVar1;
  UA_NodeStoreEntry **ppUVar2;
  UA_AddReferencesItem *in_RCX;
  UA_DeleteReferencesItem *item_00;
  UA_Node *node;
  UA_Node *node_00;
  UA_Node *node_01;
  UA_NodeStore *ns;
  byte bVar3;
  UA_NodeId local_128;
  UA_Byte *local_110;
  size_t sStack_108;
  UA_Byte *local_100;
  ulong local_f8;
  UA_Byte *pUStack_f0;
  undefined8 local_e8;
  size_t sStack_e0;
  UA_Byte *local_d8;
  size_t sStack_d0;
  UA_Byte *local_c8;
  size_t sStack_c0;
  UA_String *local_b8;
  undefined8 uStack_b0;
  undefined1 auStack_a8 [8];
  UA_DeleteReferencesItem deleteItem;
  
  UVar1 = 0x80400000;
  if ((session->clientDescription).applicationName.text.data == (UA_Byte *)0x0) {
    ppUVar2 = findNode(server->nodestore,(UA_NodeId *)session);
    if (ppUVar2 == (UA_NodeStoreEntry **)0x0) {
      UVar1 = 0x80340000;
    }
    else {
      UVar1 = addOneWayReference((UA_Server *)&(*ppUVar2)->node,session,node,in_RCX);
      if (UVar1 == 0) {
        local_128.identifier.string.data =
             (UA_Byte *)(session->clientDescription).discoveryProfileUri.length;
        local_128._0_8_ = (session->clientDescription).gatewayServerUri.length;
        local_128.identifier.string.length =
             (size_t)(session->clientDescription).gatewayServerUri.data;
        pUStack_f0 = (UA_Byte *)0x0;
        local_e8._0_4_ = UA_APPLICATIONTYPE_SERVER;
        local_e8._4_4_ = 0;
        local_c8 = (UA_Byte *)0x0;
        sStack_c0 = 0;
        local_b8 = (UA_String *)0x0;
        uStack_b0._0_1_ = false;
        uStack_b0._1_7_ = 0;
        local_100 = (session->clientDescription).applicationName.locale.data;
        local_110 = (session->clientDescription).productUri.data;
        sStack_108 = (session->clientDescription).applicationName.locale.length;
        bVar3 = (byte)(session->clientDescription).applicationName.text.length;
        local_f8 = (ulong)bVar3 ^ 1;
        sStack_d0 = (session->clientDescription).productUri.length;
        sStack_e0 = (session->clientDescription).applicationUri.length;
        local_d8 = (session->clientDescription).applicationUri.data;
        ns = server->nodestore;
        ppUVar2 = findNode(ns,&local_128);
        if (ppUVar2 == (UA_NodeStoreEntry **)0x0) {
          UVar1 = 0x80340000;
        }
        else {
          UVar1 = addOneWayReference((UA_Server *)&(*ppUVar2)->node,(UA_Session *)&local_128,node_00
                                     ,in_RCX);
          if (UVar1 == 0) {
            return 0;
          }
          bVar3 = (byte)(session->clientDescription).applicationName.text.length;
          ns = server->nodestore;
        }
        deleteItem.sourceNodeId.identifier.string.length =
             (session->clientDescription).productUri.length;
        auStack_a8 = (undefined1  [8])(session->clientDescription).applicationUri.length;
        deleteItem.sourceNodeId._0_8_ = (session->clientDescription).applicationUri.data;
        deleteItem.sourceNodeId.identifier.string.data =
             (session->clientDescription).productUri.data;
        deleteItem.referenceTypeId._0_8_ =
             (session->clientDescription).applicationName.locale.length;
        item_00 = (UA_DeleteReferencesItem *)
                  (session->clientDescription).applicationName.locale.data;
        deleteItem._48_8_ = (session->clientDescription).gatewayServerUri.length;
        deleteItem.targetNodeId.nodeId._0_8_ = (session->clientDescription).gatewayServerUri.data;
        deleteItem.targetNodeId.nodeId.identifier.string.length =
             (session->clientDescription).discoveryProfileUri.length;
        deleteItem.targetNodeId.nodeId.identifier.string.data =
             (session->clientDescription).discoveryProfileUri.data;
        deleteItem.targetNodeId.namespaceUri.length = (session->clientDescription).discoveryUrlsSize
        ;
        deleteItem.targetNodeId.namespaceUri.data =
             (UA_Byte *)(session->clientDescription).discoveryUrls;
        deleteItem.targetNodeId.serverIndex._0_1_ = 0;
        deleteItem.referenceTypeId.identifier.string.length = (size_t)item_00;
        deleteItem.referenceTypeId.identifier.guid.data4[0] = bVar3;
        ppUVar2 = findNode(ns,(UA_NodeId *)session);
        if (ppUVar2 != (UA_NodeStoreEntry **)0x0) {
          deleteOneWayReference
                    ((UA_Server *)&(*ppUVar2)->node,(UA_Session *)auStack_a8,node_01,item_00);
        }
      }
    }
  }
  return UVar1;
}

Assistant:

static UA_StatusCode
addReference(UA_Server *server, UA_Session *session,
             const UA_AddReferencesItem *item) {
    /* Currently no expandednodeids are allowed */
    if(item->targetServerUri.length > 0)
        return UA_STATUSCODE_BADNOTIMPLEMENTED;

    /* Add the first direction */
#ifndef UA_ENABLE_EXTERNAL_NAMESPACES
    UA_StatusCode retval = UA_Server_editNode(server, session, &item->sourceNodeId,
                                              (UA_EditNodeCallback)addOneWayReference,
                                              item);
#else
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    UA_Boolean handledExternally = UA_FALSE;
    for(size_t j = 0; j <server->externalNamespacesSize; ++j) {
        if(item->sourceNodeId.namespaceIndex != server->externalNamespaces[j].index) {
            continue;
        } else {
            UA_ExternalNodeStore *ens = &server->externalNamespaces[j].externalNodeStore;
            retval = (UA_StatusCode)ens->addOneWayReference(ens->ensHandle, item);
            handledExternally = UA_TRUE;
            break;
        }
    }
    if(!handledExternally)
        retval = UA_Server_editNode(server, session, &item->sourceNodeId,
                                    (UA_EditNodeCallback)addOneWayReference, item);
#endif

    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Add the second direction */
    UA_AddReferencesItem secondItem;
    UA_AddReferencesItem_init(&secondItem);
    secondItem.sourceNodeId = item->targetNodeId.nodeId;
    secondItem.referenceTypeId = item->referenceTypeId;
    secondItem.isForward = !item->isForward;
    secondItem.targetNodeId.nodeId = item->sourceNodeId;
    /* keep default secondItem.targetNodeClass = UA_NODECLASS_UNSPECIFIED */
#ifndef UA_ENABLE_EXTERNAL_NAMESPACES
    retval = UA_Server_editNode(server, session, &secondItem.sourceNodeId,
                                (UA_EditNodeCallback)addOneWayReference, &secondItem);
#else
    handledExternally = UA_FALSE;
    for(size_t j = 0; j < server->externalNamespacesSize; ++j) {
        if(secondItem.sourceNodeId.namespaceIndex != server->externalNamespaces[j].index) {
            continue;
        } else {
            UA_ExternalNodeStore *ens = &server->externalNamespaces[j].externalNodeStore;
            retval = (UA_StatusCode)ens->addOneWayReference(ens->ensHandle, &secondItem);
            handledExternally = UA_TRUE;
            break;
        }
    }
    if(!handledExternally)
        retval = UA_Server_editNode(server, session, &secondItem.sourceNodeId,
                                    (UA_EditNodeCallback)addOneWayReference, &secondItem);
#endif

    /* remove reference if the second direction failed */
    if(retval != UA_STATUSCODE_GOOD) {
        UA_DeleteReferencesItem deleteItem;
        deleteItem.sourceNodeId = item->sourceNodeId;
        deleteItem.referenceTypeId = item->referenceTypeId;
        deleteItem.isForward = item->isForward;
        deleteItem.targetNodeId = item->targetNodeId;
        deleteItem.deleteBidirectional = false;
        /* ignore returned status code */
        UA_Server_editNode(server, session, &item->sourceNodeId,
                           (UA_EditNodeCallback)deleteOneWayReference, &deleteItem);
    }
    return retval;
}